

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::
AddNestedExtensions<google::protobuf::DescriptorProto>
          (DescriptorIndex *this,StringPiece filename,DescriptorProto *message_type)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  reference message_type_00;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_01;
  reference field;
  FieldDescriptorProto *extension;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *__range2_1;
  DescriptorProto *nested_type;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<google::protobuf::DescriptorProto> *__range2;
  DescriptorProto *message_type_local;
  DescriptorIndex *this_local;
  StringPiece filename_local;
  
  this_00 = DescriptorProto::nested_type(message_type);
  __end0 = RepeatedPtrField<google::protobuf::DescriptorProto>::begin(this_00);
  nested_type = (DescriptorProto *)RepeatedPtrField<google::protobuf::DescriptorProto>::end(this_00)
  ;
  while( true ) {
    bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator!=
                      (&__end0,(iterator *)&nested_type);
    if (!bVar1) {
      this_01 = DescriptorProto::extension(message_type);
      __end0_1 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::begin(this_01);
      extension = (FieldDescriptorProto *)
                  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::end(this_01);
      while( true ) {
        bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                operator!=(&__end0_1,(iterator *)&extension);
        if (!bVar1) {
          return true;
        }
        field = internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::
                operator*(&__end0_1);
        bVar1 = AddExtension<google::protobuf::FieldDescriptorProto>(this,filename,field);
        if (!bVar1) break;
        internal::RepeatedPtrIterator<const_google::protobuf::FieldDescriptorProto>::operator++
                  (&__end0_1);
      }
      return false;
    }
    message_type_00 =
         internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator*(&__end0);
    bVar1 = AddNestedExtensions<google::protobuf::DescriptorProto>(this,filename,message_type_00);
    if (!bVar1) break;
    internal::RepeatedPtrIterator<const_google::protobuf::DescriptorProto>::operator++(&__end0);
  }
  return false;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddNestedExtensions(
    StringPiece filename, const DescProto& message_type) {
  for (const auto& nested_type : message_type.nested_type()) {
    if (!AddNestedExtensions(filename, nested_type)) return false;
  }
  for (const auto& extension : message_type.extension()) {
    if (!AddExtension(filename, extension)) return false;
  }
  return true;
}